

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

int * floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,float *logmdct,float *logmask)

{
  size_t __n;
  float fVar1;
  vorbis_info_floor1 *info;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  vorbis_look_floor1 *pvVar21;
  int iVar22;
  long lVar23;
  lsfit_acc *a;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  int ly1;
  int ly0;
  int y1;
  int y0;
  int fit_valueB [65];
  int fit_valueA [65];
  int hineighbor [65];
  int loneighbor [65];
  int memo [65];
  lsfit_acc fits [64];
  uint local_1414;
  uint local_1410;
  uint local_140c;
  uint local_1408;
  uint local_1404;
  vorbis_look_floor1 *local_1400;
  long local_13f8;
  float *local_13f0;
  float *local_13e8;
  uint local_13dc;
  int local_13d8;
  int local_13d4;
  vorbis_block *local_13d0;
  long local_13c8;
  long local_13c0;
  undefined1 local_13b8 [16];
  long local_13a0;
  float *local_1398;
  uint local_1390;
  uint local_138c;
  uint local_1388 [68];
  uint local_1278 [67];
  int aiStack_116c [69];
  int local_1058 [68];
  int local_f48 [68];
  lsfit_acc local_e38 [64];
  
  info = look->vi;
  iVar5 = look->n;
  iVar4 = look->posts;
  local_13f8 = (long)iVar4;
  local_13e8 = logmdct;
  local_13d0 = vb;
  if (0 < local_13f8) {
    lVar12 = local_13f8 + -1;
    auVar30._8_4_ = (int)lVar12;
    auVar30._0_8_ = lVar12;
    auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar30 = auVar30 ^ _DAT_001e8190;
    auVar29 = _DAT_001e93e0;
    auVar25 = _DAT_001e8180;
    do {
      auVar28 = auVar25 ^ _DAT_001e8190;
      iVar7 = auVar30._0_4_;
      iVar31 = auVar30._4_4_;
      iVar22 = auVar30._12_4_;
      if ((bool)(~(auVar28._4_4_ == iVar31 && iVar7 < auVar28._0_4_ || iVar31 < auVar28._4_4_) & 1))
      {
        *(undefined4 *)((long)local_1278 + lVar12) = 0xffffff38;
      }
      if ((auVar28._12_4_ != iVar22 || auVar28._8_4_ <= auVar30._8_4_) && auVar28._12_4_ <= iVar22)
      {
        *(undefined4 *)((long)local_1278 + lVar12 + 4) = 0xffffff38;
      }
      iVar13 = SUB164(auVar29 ^ _DAT_001e8190,4);
      if (iVar13 <= iVar31 && (iVar13 != iVar31 || SUB164(auVar29 ^ _DAT_001e8190,0) <= iVar7)) {
        *(undefined4 *)((long)local_1278 + lVar12 + 8) = 0xffffff38;
        *(undefined4 *)((long)local_1278 + lVar12 + 0xc) = 0xffffff38;
      }
      lVar23 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar23 + 4;
      lVar23 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar23 + 4;
      lVar12 = lVar12 + 0x10;
    } while ((local_13f8 + 3U >> 2 & 0x3fffffff) << 4 != lVar12);
    if (0 < iVar4) {
      lVar12 = 0;
      auVar28 = _DAT_001e93e0;
      auVar26 = _DAT_001e8180;
      do {
        auVar29 = auVar26 ^ _DAT_001e8190;
        if ((bool)(~(auVar29._4_4_ == iVar31 && iVar7 < auVar29._0_4_ || iVar31 < auVar29._4_4_) & 1
                  )) {
          *(undefined4 *)((long)local_1388 + lVar12) = 0xffffff38;
        }
        if ((auVar29._12_4_ != iVar22 || auVar29._8_4_ <= auVar30._8_4_) && auVar29._12_4_ <= iVar22
           ) {
          *(undefined4 *)((long)local_1388 + lVar12 + 4) = 0xffffff38;
        }
        iVar13 = SUB164(auVar28 ^ _DAT_001e8190,4);
        if (iVar13 <= iVar31 && (iVar13 != iVar31 || SUB164(auVar28 ^ _DAT_001e8190,0) <= iVar7)) {
          *(undefined4 *)((long)local_1388 + lVar12 + 8) = 0xffffff38;
          *(undefined4 *)((long)local_1388 + lVar12 + 0xc) = 0xffffff38;
        }
        lVar23 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar23 + 4;
        lVar23 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar23 + 4;
        lVar12 = lVar12 + 0x10;
      } while ((local_13f8 + 3U >> 2 & 0x3fffffff) << 4 != lVar12);
      if (0 < iVar4) {
        __n = local_13f8 * 4;
        lVar12 = 0;
        local_1400 = look;
        local_13f0 = logmask;
        local_13b8 = auVar30;
        memset(local_1058,0,__n);
        look = local_1400;
        auVar24 = _DAT_001e93e0;
        auVar27 = _DAT_001e8180;
        do {
          auVar29 = auVar27 ^ _DAT_001e8190;
          if ((bool)(~(auVar29._4_4_ == local_13b8._4_4_ && (int)local_13b8._0_4_ < auVar29._0_4_ ||
                      (int)local_13b8._4_4_ < auVar29._4_4_) & 1)) {
            *(undefined4 *)((long)aiStack_116c + lVar12 + 4) = 1;
          }
          if ((auVar29._12_4_ != local_13b8._12_4_ || auVar29._8_4_ <= (int)local_13b8._8_4_) &&
              auVar29._12_4_ <= (int)local_13b8._12_4_) {
            *(undefined4 *)((long)aiStack_116c + lVar12 + 8) = 1;
          }
          iVar7 = SUB164(auVar24 ^ _DAT_001e8190,4);
          if (iVar7 <= (int)local_13b8._4_4_ &&
              (iVar7 != local_13b8._4_4_ ||
              SUB164(auVar24 ^ _DAT_001e8190,0) <= (int)local_13b8._0_4_)) {
            *(undefined4 *)((long)aiStack_116c + lVar12 + 0xc) = 1;
            *(undefined4 *)((long)aiStack_116c + lVar12 + 0x10) = 1;
          }
          lVar23 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 4;
          auVar27._8_8_ = lVar23 + 4;
          lVar23 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 4;
          auVar24._8_8_ = lVar23 + 4;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(iVar4 + 3U >> 2) << 4 != lVar12);
        logmask = local_13f0;
        if (0 < iVar4) {
          memset(local_f48,0xff,__n);
          logmask = local_13f0;
          if (iVar4 == 1) {
            return (int *)0x0;
          }
          lVar23 = 1;
          a = local_e38;
          lVar12 = 0;
          iVar4 = look->sorted_index[0];
          do {
            iVar7 = look->sorted_index[lVar23];
            iVar4 = accumulate_fit(logmask,local_13e8,iVar4,iVar7,a,iVar5,info);
            lVar12 = lVar12 + iVar4;
            lVar23 = lVar23 + 1;
            a = a + 1;
            iVar4 = iVar7;
          } while (local_13f8 != lVar23);
          goto LAB_001def0b;
        }
      }
    }
  }
  if (iVar4 != 0) {
    return (int *)0x0;
  }
  iVar5 = accumulate_fit(logmask,logmdct,0,iVar5,local_e38,iVar5,info);
  lVar12 = (long)iVar5;
LAB_001def0b:
  if (lVar12 == 0) {
    return (int *)0x0;
  }
  local_138c = 0xffffff38;
  local_1390 = 0xffffff38;
  local_1400 = look;
  local_13f0 = logmask;
  fit_line(local_e38,(int)local_13f8 + -1,(int *)&local_138c,(int *)&local_1390,info);
  local_1278[0] = local_138c;
  local_1388[0] = local_138c;
  local_1388[1] = local_1390;
  local_1278[1] = local_1390;
  lVar12 = local_13f8;
  pvVar21 = local_1400;
  if (2 < (int)local_13f8) {
    lVar23 = 2;
    do {
      iVar5 = pvVar21->reverse_index[lVar23];
      lVar15 = (long)iVar5;
      lVar9 = (long)local_1058[lVar15];
      iVar4 = aiStack_116c[lVar15 + 1];
      if (local_f48[lVar9] != iVar4) {
        lVar12 = (long)iVar4;
        iVar7 = pvVar21->reverse_index[lVar9];
        local_13a0 = (long)iVar7;
        local_13d4 = pvVar21->reverse_index[lVar12];
        local_f48[lVar9] = iVar4;
        uVar6 = local_1278[lVar9];
        uVar19 = local_1388[lVar9];
        uVar14 = uVar19;
        if ((-1 < (int)uVar6) && (uVar14 = uVar6, -1 < (int)uVar19)) {
          uVar14 = uVar19 + uVar6 >> 1;
        }
        uVar6 = local_1278[lVar12];
        uVar19 = local_1388[lVar12];
        uVar17 = uVar19;
        if ((-1 < (int)uVar6) && (uVar17 = uVar6, -1 < (int)uVar19)) {
          uVar17 = uVar19 + uVar6 >> 1;
        }
        local_13d8 = iVar4;
        if ((uVar14 == 0xffffffff) || (uVar17 == 0xffffffff)) {
          exit(1);
        }
        uVar6 = info->postlist[lVar9];
        lVar18 = (long)(int)uVar6;
        iVar4 = info->postlist[lVar12];
        iVar22 = uVar17 - uVar14;
        uVar19 = iVar4 - uVar6;
        iVar31 = -iVar22;
        if (0 < iVar22) {
          iVar31 = iVar22;
        }
        iVar13 = (int)(local_13f0[lVar18] * 7.3142858 + 1023.5);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0x3fe < iVar13) {
          iVar13 = 0x3ff;
        }
        iVar10 = (iVar22 / (int)uVar19) * uVar19;
        iVar3 = -iVar10;
        if (iVar10 < 1) {
          iVar3 = iVar10;
        }
        local_140c = uVar14;
        local_13dc = uVar17;
        local_13c8 = lVar12;
        local_13c0 = lVar9;
        if (local_13f0[lVar18] <= local_13e8[lVar18] + info->twofitatten) {
          if (((float)iVar13 <= info->maxover + (float)(int)uVar14) &&
             ((float)(int)uVar14 - info->maxunder <= (float)iVar13)) goto LAB_001df0fd;
        }
        else {
LAB_001df0fd:
          uVar11 = (uVar14 - iVar13) * (uVar14 - iVar13);
          lVar18 = lVar18 + 1;
          uVar17 = 1;
          if ((int)lVar18 < iVar4) {
            local_13b8._0_8_ = local_13e8 + lVar18;
            local_1398 = local_13f0 + lVar18;
            lVar12 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + iVar31 + iVar3;
              uVar17 = 0;
              uVar16 = 0;
              if ((int)uVar19 <= iVar13) {
                uVar17 = iVar22 >> 0x1f | 1;
                uVar16 = uVar19;
              }
              iVar20 = (int)(local_1398[lVar12] * 7.3142858 + 1023.5);
              iVar10 = iVar20;
              if (iVar20 < 1) {
                iVar10 = 0;
              }
              if (0x3fe < iVar10) {
                iVar10 = 0x3ff;
              }
              uVar14 = uVar14 + iVar22 / (int)uVar19 + uVar17;
              if ((local_1398[lVar12] <= (local_13e8 + lVar18)[lVar12] + info->twofitatten) &&
                 (0 < iVar20)) {
                if ((info->maxover + (float)(int)uVar14 < (float)iVar10) ||
                   ((float)iVar10 < (float)(int)uVar14 - info->maxunder)) goto LAB_001df2d4;
              }
              iVar13 = iVar13 - uVar16;
              uVar11 = uVar11 + (uVar14 - iVar10) * (uVar14 - iVar10);
              lVar12 = lVar12 + 1;
              uVar17 = uVar19;
            } while (~uVar6 + iVar4 != (int)lVar12);
          }
          fVar1 = info->maxerr;
          if (((fVar1 < (info->maxover * info->maxover) / (float)(int)uVar17) ||
              (fVar1 < (info->maxunder * info->maxunder) / (float)(int)uVar17)) ||
             ((float)(int)(uVar11 / uVar17) <= fVar1)) {
            local_1278[lVar23] = 0xffffff38;
            local_1388[lVar23] = 0xffffff38;
            lVar12 = local_13f8;
            pvVar21 = local_1400;
            goto LAB_001df462;
          }
        }
LAB_001df2d4:
        local_1404 = 0xffffff38;
        local_1410 = 0xffffff38;
        local_1414 = 0xffffff38;
        local_1408 = 0xffffff38;
        iVar4 = fit_line(local_e38 + local_13a0,iVar5 - iVar7,(int *)&local_1404,(int *)&local_1410,
                         info);
        iVar7 = fit_line(local_e38 + lVar15,local_13d4 - iVar5,(int *)&local_1414,(int *)&local_1408
                         ,info);
        lVar12 = local_13f8;
        pvVar21 = local_1400;
        if (iVar4 == 0) {
          if (iVar7 != 0) {
            local_1414 = local_1410;
            local_1408 = local_13dc;
          }
        }
        else {
          local_1404 = local_140c;
          local_1410 = local_1414;
          if (iVar7 != 0) {
            local_1278[lVar23] = 0xffffff38;
            local_1388[lVar23] = 0xffffff38;
            goto LAB_001df462;
          }
        }
        local_1388[local_13c0] = local_1404;
        if ((int)local_13c0 == 0) {
          local_1278[local_13c0] = local_1404;
        }
        local_1278[lVar23] = local_1410;
        local_1388[lVar23] = local_1414;
        local_1278[local_13c8] = local_1408;
        if ((int)local_13c8 == 1) {
          local_1388[local_13c8] = local_1408;
        }
        if (-1 < (int)(local_1410 & local_1414)) {
          if (0 < iVar5) {
            lVar9 = (ulong)(iVar5 - 1) + 1;
            do {
              if (aiStack_116c[lVar9] != local_13d8) break;
              aiStack_116c[lVar9] = (int)lVar23;
              lVar18 = lVar9 + -1;
              bVar2 = 0 < lVar9;
              lVar9 = lVar18;
            } while (lVar18 != 0 && bVar2);
          }
          lVar15 = lVar15 + 1;
          if ((int)lVar15 < (int)local_13f8) {
            do {
              if (local_1058[lVar15] != (int)local_13c0) break;
              local_1058[lVar15] = (int)lVar23;
              lVar15 = lVar15 + 1;
            } while (local_13f8 != lVar15);
          }
        }
      }
LAB_001df462:
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar12);
  }
  uVar19 = local_1278[0];
  uVar6 = local_1388[0];
  puVar8 = (uint *)_vorbis_block_alloc(local_13d0,lVar12 * 4);
  uVar14 = uVar6;
  if ((-1 < (int)uVar19) && (uVar14 = uVar19, -1 < (int)uVar6)) {
    uVar14 = uVar6 + uVar19 >> 1;
  }
  *puVar8 = uVar14;
  uVar6 = local_1388[1];
  if ((-1 < (int)local_1278[1]) && (uVar6 = local_1278[1], -1 < (int)local_1388[1])) {
    uVar6 = local_1388[1] + local_1278[1] >> 1;
  }
  puVar8[1] = uVar6;
  if (2 < (int)lVar12) {
    lVar23 = 0;
    do {
      iVar4 = (puVar8[pvVar21->hineighbor[lVar23]] & 0x7fff) -
              (puVar8[pvVar21->loneighbor[lVar23]] & 0x7fff);
      iVar5 = -iVar4;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      iVar7 = ((info->postlist[lVar23 + 2] - info->postlist[pvVar21->loneighbor[lVar23]]) * iVar5) /
              (info->postlist[pvVar21->hineighbor[lVar23]] -
              info->postlist[pvVar21->loneighbor[lVar23]]);
      iVar5 = -iVar7;
      if (-1 < iVar4) {
        iVar5 = iVar7;
      }
      uVar6 = local_1278[lVar23 + 2];
      uVar19 = local_1388[lVar23 + 2];
      uVar14 = uVar19;
      if ((-1 < (int)uVar6) && (uVar14 = uVar6, -1 < (int)uVar19)) {
        uVar14 = uVar19 + uVar6 >> 1;
      }
      uVar19 = iVar5 + (puVar8[pvVar21->loneighbor[lVar23]] & 0x7fff);
      uVar17 = uVar19 | 0x8000;
      uVar6 = uVar14;
      if (uVar19 == uVar14) {
        uVar6 = uVar17;
      }
      if ((int)uVar14 < 0) {
        uVar6 = uVar17;
      }
      puVar8[lVar23 + 2] = uVar6;
      lVar23 = lVar23 + 1;
    } while (lVar12 + -2 != lVar23);
    return (int *)puVar8;
  }
  return (int *)puVar8;
}

Assistant:

int *floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          const float *logmdct,   /* in */
                          const float *logmask){
  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long n=look->n;
  long posts=look->posts;
  long nonzero=0;
  lsfit_acc fits[VIF_POSIT+1];
  int fit_valueA[VIF_POSIT+2]; /* index by range list position */
  int fit_valueB[VIF_POSIT+2]; /* index by range list position */

  int loneighbor[VIF_POSIT+2]; /* sorted index of range list position (+2) */
  int hineighbor[VIF_POSIT+2];
  int *output=NULL;
  int memo[VIF_POSIT+2];

  for(i=0;i<posts;i++)fit_valueA[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)fit_valueB[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)loneighbor[i]=0; /* 0 for the implicit 0 post */
  for(i=0;i<posts;i++)hineighbor[i]=1; /* 1 for the implicit post at n */
  for(i=0;i<posts;i++)memo[i]=-1;      /* no neighbor yet */

  /* quantize the relevant floor points and collect them into line fit
     structures (one per minimal division) at the same time */
  if(posts==0){
    nonzero+=accumulate_fit(logmask,logmdct,0,n,fits,n,info);
  }else{
    for(i=0;i<posts-1;i++)
      nonzero+=accumulate_fit(logmask,logmdct,look->sorted_index[i],
                              look->sorted_index[i+1],fits+i,
                              n,info);
  }

  if(nonzero){
    /* start by fitting the implicit base case.... */
    int y0=-200;
    int y1=-200;
    fit_line(fits,posts-1,&y0,&y1,info);

    fit_valueA[0]=y0;
    fit_valueB[0]=y0;
    fit_valueB[1]=y1;
    fit_valueA[1]=y1;

    /* Non degenerate case */
    /* start progressive splitting.  This is a greedy, non-optimal
       algorithm, but simple and close enough to the best
       answer. */
    for(i=2;i<posts;i++){
      int sortpos=look->reverse_index[i];
      int ln=loneighbor[sortpos];
      int hn=hineighbor[sortpos];

      /* eliminate repeat searches of a particular range with a memo */
      if(memo[ln]!=hn){
        /* haven't performed this error search yet */
        int lsortpos=look->reverse_index[ln];
        int hsortpos=look->reverse_index[hn];
        memo[ln]=hn;

        {
          /* A note: we want to bound/minimize *local*, not global, error */
          int lx=info->postlist[ln];
          int hx=info->postlist[hn];
          int ly=post_Y(fit_valueA,fit_valueB,ln);
          int hy=post_Y(fit_valueA,fit_valueB,hn);

          if(ly==-1 || hy==-1){
            exit(1);
          }

          if(inspect_error(lx,hx,ly,hy,logmask,logmdct,info)){
            /* outside error bounds/begin search area.  Split it. */
            int ly0=-200;
            int ly1=-200;
            int hy0=-200;
            int hy1=-200;
            int ret0=fit_line(fits+lsortpos,sortpos-lsortpos,&ly0,&ly1,info);
            int ret1=fit_line(fits+sortpos,hsortpos-sortpos,&hy0,&hy1,info);

            if(ret0){
              ly0=ly;
              ly1=hy0;
            }
            if(ret1){
              hy0=ly1;
              hy1=hy;
            }

            if(ret0 && ret1){
              fit_valueA[i]=-200;
              fit_valueB[i]=-200;
            }else{
              /* store new edge values */
              fit_valueB[ln]=ly0;
              if(ln==0)fit_valueA[ln]=ly0;
              fit_valueA[i]=ly1;
              fit_valueB[i]=hy0;
              fit_valueA[hn]=hy1;
              if(hn==1)fit_valueB[hn]=hy1;

              if(ly1>=0 || hy0>=0){
                /* store new neighbor values */
                for(j=sortpos-1;j>=0;j--)
                  if(hineighbor[j]==hn)
                    hineighbor[j]=i;
                  else
                    break;
                for(j=sortpos+1;j<posts;j++)
                  if(loneighbor[j]==ln)
                    loneighbor[j]=i;
                  else
                    break;
              }
            }
          }else{
            fit_valueA[i]=-200;
            fit_valueB[i]=-200;
          }
        }
      }
    }

    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    output[0]=post_Y(fit_valueA,fit_valueB,0);
    output[1]=post_Y(fit_valueA,fit_valueB,1);

    /* fill in posts marked as not using a fit; we will zero
       back out to 'unused' when encoding them so long as curve
       interpolation doesn't force them into use */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=output[ln];
      int y1=output[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);
      int vx=post_Y(fit_valueA,fit_valueB,i);

      if(vx>=0 && predicted!=vx){
        output[i]=vx;
      }else{
        output[i]= predicted|0x8000;
      }
    }
  }

  return(output);

}